

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O3

void ansv<unsigned_long,1,0,0>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  int iVar1;
  int iVar2;
  unsigned_long uVar3;
  void *pvVar4;
  ulong uVar5;
  pair<unsigned_long,_unsigned_long> *ppVar6;
  unsigned_long *puVar7;
  comm *comm_00;
  _Map_pointer pppVar8;
  _Map_pointer pppVar9;
  comm *comm_01;
  unsigned_long uVar10;
  _Elt_pointer ppVar11;
  _Elt_pointer ppVar12;
  _Map_pointer pppVar13;
  _Map_pointer pppVar14;
  _Elt_pointer ppVar15;
  ulong uVar16;
  _Elt_pointer ppVar17;
  size_t sVar18;
  pointer puVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong *puVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  bool bVar31;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_1f8;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_1a0;
  _Elt_pointer local_198;
  _Elt_pointer ppStack_190;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_180;
  _Elt_pointer local_178;
  _Elt_pointer ppStack_170;
  size_t local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_158;
  _Map_pointer local_140;
  pair<unsigned_long,_unsigned_long> local_130;
  ulong local_120;
  _Elt_pointer local_118;
  _Elt_pointer ppStack_110;
  comm *local_108;
  size_type local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  _Map_pointer local_80;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_58;
  
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_1a0 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_180 = right_nsv;
  local_178 = (_Elt_pointer)left_nsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_1f8,0);
  local_100 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  local_108 = comm;
  uVar10 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_100,comm);
  lVar28 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar28 != 0) {
    lVar28 = lVar28 >> 3;
    do {
      ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          uVar29 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar28 + -1];
          if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar17) {
            if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first <= uVar29
               ) break;
            operator_delete(ppVar17);
            ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar17 + 0x20;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17 + 0x1f;
            ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar17;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar29)
            break;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar11);
        ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
        if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar11) {
          do {
            uVar3 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar28 + -1];
            if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar17) {
              if (uVar3 != local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].
                           first) break;
              operator_delete(ppVar17);
              ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar17 + 0x20;
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17 + 0x1f;
              ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar17;
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              if (uVar3 != local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              break;
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
          } while (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar11);
        }
      }
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)((uVar10 - 1) + lVar28);
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar28 + -1];
      if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1f8,(pair<unsigned_long,_unsigned_long> *)&local_158);
      }
      else {
        (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar28 = lVar28 + -1;
    } while (lVar28 != 0);
  }
  local_58.current._M_cur = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58.current._M_first = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58.current._M_last = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58.current._M_node = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_78.current._M_cur = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_78.current._M_first = local_1f8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_78.current._M_last = local_1f8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_78.current._M_node = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_158,&local_58,&local_78,(allocator_type *)&local_98);
  pvVar4 = *(void **)local_1a0;
  *(pointer *)local_1a0 =
       local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_1a0 + 8) =
       local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_1a0 + 0x10) =
       local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_160 = nonsv;
  if ((pvVar4 != (void *)0x0) &&
     (operator_delete(pvVar4),
     local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar9 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar8 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_118 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_198 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar29 = ((long)local_1f8._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
           ((long)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_1f8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
           * 0x20;
  pppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  if (uVar29 == 0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 0, indexing_type = 0]"
                 );
  }
  for (; pppVar13 < pppVar9; pppVar13 = pppVar13 + 1) {
    operator_delete(pppVar13[1]);
  }
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar17;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar8;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_198;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = local_118;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar16 = 0;
    do {
      ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          uVar24 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar16];
          if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar17) {
            if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first <= uVar24
               ) break;
            operator_delete(ppVar17);
            ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar17 + 0x20;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17 + 0x1f;
            ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar17;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar24)
            break;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar11);
        ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
        if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar11) {
          do {
            uVar3 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar16];
            if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar17) {
              if (uVar3 != local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].
                           first) break;
              operator_delete(ppVar17);
              ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar17 + 0x20;
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17 + 0x1f;
              ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar17;
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              if (uVar3 != local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              break;
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
          } while (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar11);
        }
      }
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar16 + uVar10);
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar16];
      if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1f8,(pair<unsigned_long,_unsigned_long> *)&local_158);
      }
      else {
        (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < (ulong)((long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppVar15 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar16 = (long)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar31 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0;
  local_198 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1f8._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1f8._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_140 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_80 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_1a0,*(undefined8 *)(local_1a0 + 8));
  pppVar9 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar8 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar28 = (long)ppVar17 - (long)local_198;
  local_198 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_120 = (local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar28 = (lVar28 >> 4) + ((long)ppVar11 - (long)ppVar15 >> 4) +
           (((uVar16 >> 3) - 1) + (ulong)bVar31) * 0x20;
  ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_110 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  comm_00 = local_108;
  if (lVar28 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 0, indexing_type = 0]"
                 );
  }
  for (; local_118 = ppVar17, local_108 = comm_00, pppVar13 < pppVar9; pppVar13 = pppVar13 + 1) {
    operator_delete(pppVar13[1]);
    ppVar17 = local_118;
    comm_00 = local_108;
  }
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar8;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_198;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = local_118;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_110;
  if (lVar28 + uVar29 != *(long *)(local_1a0 + 8) - *(long *)local_1a0 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 0, indexing_type = 0]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_158,&local_120,1,comm_00);
  local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_98,(long)comm_00->m_size,(value_type_conflict *)&local_b0,
             (allocator_type *)&local_f8);
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b0,(long)comm_00->m_size,(value_type_conflict *)&local_f8,
             (allocator_type *)&local_c8);
  comm_01 = local_108;
  iVar1 = comm_00->m_rank;
  lVar28 = (long)iVar1;
  if (0 < lVar28) {
    uVar16 = *(ulong *)((long)local_158.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar28 * 8 + -8);
    local_198 = (_Elt_pointer)
                local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    lVar30 = lVar28;
    lVar21 = 0;
    do {
      lVar20 = lVar30 + -1;
      uVar24 = lVar21 + 1U;
      if (lVar21 + 1U < uVar29) {
        uVar24 = uVar29;
      }
      uVar5 = *(ulong *)((long)local_158.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar30 * 8 + -8);
      lVar22 = lVar21 + -1;
      puVar27 = (ulong *)(lVar21 * 0x10 + *(long *)local_1a0);
      do {
        lVar23 = uVar24 - 1;
        if (lVar22 + (1 - uVar24) == -1) break;
        lVar23 = lVar22 + 1;
        uVar26 = *puVar27;
        lVar22 = lVar23;
        puVar27 = puVar27 + 2;
      } while (uVar5 <= uVar26);
      if (uVar5 <= uVar16) {
        *(long *)((long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar20 * 8) =
             (lVar23 - lVar21) + 1;
        *(long *)((long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar20 * 8) = lVar21;
        uVar16 = uVar5;
        if (*(ulong *)((long)local_158.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar20 * 8) < local_120)
        break;
      }
      bVar31 = 1 < lVar30;
      lVar30 = lVar20;
      lVar21 = lVar23;
    } while (bVar31);
  }
  iVar2 = local_108->m_size;
  if (iVar1 < iVar2 + -1) {
    lVar30 = *(long *)local_1a0;
    uVar16 = ((unsigned_long *)
             ((long)local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))[lVar28];
    lVar28 = lVar28 + 1;
    uVar24 = (*(long *)(local_1a0 + 8) - lVar30 >> 4) - 1;
    do {
      uVar5 = local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar28];
      uVar26 = uVar24;
      if (uVar29 < uVar24) {
        puVar27 = (ulong *)(uVar24 * 0x10 + lVar30);
        uVar25 = uVar24;
        do {
          uVar26 = uVar25;
          if (*puVar27 < uVar5) break;
          uVar25 = uVar25 - 1;
          puVar27 = puVar27 + -2;
          uVar26 = uVar29;
        } while (uVar29 < uVar25);
      }
      if (uVar5 <= uVar16) {
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar28] = (uVar24 - uVar26) + 1;
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar28] = uVar26;
        uVar16 = uVar5;
        if (local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar28] < local_120) break;
      }
      lVar28 = lVar28 + 1;
      uVar24 = uVar26;
    } while (iVar2 != (int)lVar28);
  }
  mxx::all2all<unsigned_long>(&local_f8,&local_98,local_108);
  mxx::impl::get_displacements<unsigned_long>(&local_c8,&local_f8);
  local_118 = (_Elt_pointer)
              (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish[-1] +
              local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1]);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_e0,(size_type)local_118,(allocator_type *)&local_130);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_1a0,&local_98,&local_b0,
             local_e0.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_f8,&local_c8,comm_01);
  uVar29 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[comm_01->m_rank];
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178,local_100);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_180,local_100);
  pppVar9 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar8 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_198 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_190 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_last;
  sVar18 = local_160;
  for (pppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node; local_160 = sVar18,
      pppVar13 < pppVar9; pppVar13 = pppVar13 + 1) {
    operator_delete(pppVar13[1]);
    sVar18 = local_160;
  }
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar8;
  lVar28 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = local_198;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_190;
  if (lVar28 != 0) {
    lVar28 = lVar28 >> 3;
    local_198 = (_Elt_pointer)(uVar10 - 1);
    do {
      uVar3 = (long)&local_198->first + lVar28;
      lVar28 = lVar28 + -1;
      if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        puVar19 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
        do {
          uVar16 = puVar19[lVar28];
          if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar17) {
            ppVar6 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            if (ppVar6[0x1f].first <= uVar16) {
              if (uVar16 == ppVar6[0x1f].first) {
                (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_178->first)
                ->_M_impl).super__Vector_impl_data._M_start[ppVar6[0x1f].second - uVar10] = uVar3;
                operator_delete(ppVar17);
                local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first =
                     local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last =
                     local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
                     local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
              }
              break;
            }
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_178->first)->
            _M_impl).super__Vector_impl_data._M_start[ppVar6[0x1f].second - uVar10] = uVar3;
            operator_delete(ppVar17);
            ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar17 + 0x20;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17 + 0x1f;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar17;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar16) {
              if (uVar16 == local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first) {
                (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_178->first)
                ->_M_impl).super__Vector_impl_data._M_start
                [local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar10] =
                     uVar3;
                local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
              }
              break;
            }
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_178->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar10] = uVar3;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      local_130.first =
           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar28];
      local_130.second = uVar3;
      if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1f8,&local_130);
      }
      else {
        (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_130.first;
        (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar3;
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (lVar28 != 0);
  }
  ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (uVar29 != 0) {
    uVar16 = 0;
    local_198 = (_Elt_pointer)(uVar29 << 4);
    do {
      if (ppVar17 == local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      puVar7 = &(local_e0.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first;
      ppVar15 = local_198 + ~uVar16;
      uVar3 = *(unsigned_long *)((long)&local_198[~uVar16].second + (long)puVar7);
      ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
      do {
        uVar24 = *(ulong *)((long)&ppVar15->first + (long)puVar7);
        if (ppVar17 == ppVar11) {
          ppVar6 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          if (ppVar6[0x1f].first <= uVar24) {
            if (uVar24 == ppVar6[0x1f].first) {
              (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_178->first)->
              _M_impl).super__Vector_impl_data._M_start[ppVar6[0x1f].second - uVar10] = uVar3;
              operator_delete(ppVar11);
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17;
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            break;
          }
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_178->first)->
          _M_impl).super__Vector_impl_data._M_start[ppVar6[0x1f].second - uVar10] = uVar3;
          operator_delete(ppVar11);
          ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar11 + 0x20;
          ppVar17 = ppVar11 + 0x1f;
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar11;
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          if (ppVar17[-1].first <= uVar24) {
            if (uVar24 == ppVar17[-1].first) {
              (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_178->first)->
              _M_impl).super__Vector_impl_data._M_start[ppVar17[-1].second - uVar10] = uVar3;
              ppVar17 = ppVar17 + -1;
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17;
            }
            break;
          }
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_178->first)->
          _M_impl).super__Vector_impl_data._M_start[ppVar17[-1].second - uVar10] = uVar3;
          ppVar17 = ppVar17 + -1;
        }
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17;
      } while (ppVar17 != local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur);
      uVar16 = uVar16 + 1;
      sVar18 = local_160;
    } while (uVar16 != uVar29);
  }
  pppVar9 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar8 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar15 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_170 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_node;
  if (ppVar17 != local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar19 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_178->first)->
              _M_impl).super__Vector_impl_data._M_start;
    ppVar12 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
    pppVar14 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node;
    do {
      if (ppVar17 == ppVar12) {
        ppVar12 = pppVar14[-1];
        pppVar14 = pppVar14 + -1;
        puVar19[ppVar12[0x1f].second - uVar10] = sVar18;
        ppVar17 = ppVar12 + 0x20;
      }
      else {
        puVar19[ppVar17[-1].second - uVar10] = sVar18;
      }
      ppVar17 = ppVar17 + -1;
      ppVar15 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_first;
    } while (ppVar17 != local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  for (; local_178 = ppVar15, pppVar13 < pppVar9; pppVar13 = pppVar13 + 1) {
    operator_delete(pppVar13[1]);
    ppVar15 = local_178;
  }
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar11;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar8;
  puVar19 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first = local_178;
  local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_170;
  if ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar19) {
    uVar16 = 0;
    do {
      uVar3 = uVar16 + uVar10;
      if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first <=
                puVar19[uVar16]) break;
            (local_180->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar10] =
                 uVar3;
            operator_delete(local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <=
                puVar19[uVar16]) break;
            (local_180->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar10] = uVar3;
            local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur);
        puVar19 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      local_130.first = puVar19[uVar16];
      local_130.second = uVar3;
      if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1f8,&local_130);
      }
      else {
        (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_130.first;
        (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar3;
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar16 = uVar16 + 1;
      puVar19 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(in->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar19 >> 3
                             ));
  }
  ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_118 != (_Elt_pointer)uVar29) {
    lVar28 = (long)local_118 - uVar29;
    lVar30 = 0;
    do {
      if (ppVar17 == ppVar11) break;
      ppVar6 = local_e0.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar29 + lVar30;
      uVar3 = local_e0.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar29 + lVar30].second;
      do {
        if (ppVar17 == local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first <=
              ppVar6->first) break;
          (local_180->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start
          [local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second - uVar10] =
               uVar3;
          operator_delete(local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          ppVar17 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          ppVar11 = local_1f8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          if (ppVar17[-1].first <= ppVar6->first) break;
          (local_180->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar17[-1].second - uVar10] = uVar3;
          ppVar17 = ppVar17 + -1;
        }
        local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar17;
      } while (ppVar17 != ppVar11);
      lVar30 = lVar30 + 1;
    } while (lVar30 != lVar28 + (ulong)(lVar28 == 0));
  }
  if (ppVar17 != ppVar11) {
    puVar19 = (local_180->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start;
    pppVar13 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar15 = local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      if (ppVar17 == ppVar15) {
        ppVar15 = pppVar13[-1];
        pppVar13 = pppVar13 + -1;
        puVar19[ppVar15[0x1f].second - uVar10] = local_160;
        ppVar17 = ppVar15 + 0x20;
      }
      else {
        puVar19[ppVar17[-1].second - uVar10] = local_160;
      }
      ppVar17 = ppVar17 + -1;
    } while (ppVar17 != ppVar11);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_1a0,&local_e0);
  if (local_e0.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_e0.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Deque_base(&local_1f8);
  return;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}